

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::NotEqual(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  BVar1 = Equal(aLeft,aRight,scriptContext);
  return (BOOL)((BVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

BOOL JavascriptOperators::NotEqual(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_NotEqual);
        JIT_HELPER_SAME_ATTRIBUTES(Op_NotEqual, Op_Equal);
        //
        // TODO: Change to use Abstract Equality Comparison Algorithm (ES3.0: S11.9.3):
        // - Evaluate left, then right, operands to preserve correct evaluation order.
        // - Call algorithm, potentially reversing arguments.
        //

        return !Equal(aLeft, aRight, scriptContext);
        JIT_HELPER_END(Op_NotEqual);
    }